

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O0

bool __thiscall
SQCompilation::SQCompilationContext::isRequireDisabled(SQCompilationContext *this,int line,int col)

{
  LineCommentsList *this_00;
  const_iterator pCVar1;
  char *pcVar2;
  long in_RDI;
  CommentData *comment;
  const_iterator __end1;
  const_iterator __begin1;
  LineCommentsList *__range1;
  LineCommentsList *lineCmts;
  Comments *in_stack_ffffffffffffffc0;
  const_iterator local_30;
  
  if (*(long *)(in_RDI + 0x110) != 0) {
    this_00 = Comments::lineComment(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
    local_30 = sqvector<SQCompilation::CommentData,_unsigned_int>::begin(this_00);
    pCVar1 = sqvector<SQCompilation::CommentData,_unsigned_int>::end(this_00);
    for (; local_30 != pCVar1; local_30 = local_30 + 1) {
      pcVar2 = strstr(local_30->text,"-skip-require");
      if (pcVar2 != (char *)0x0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SQCompilationContext::isRequireDisabled(int line, int col) {
  if (!_comments)
    return false;

  auto &lineCmts = _comments->lineComment(line);
  for (auto &comment : lineCmts) {
    if (strstr(comment.text, "-skip-require"))
      return true;
  }

  return false;
}